

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O2

void __thiscall OpenMD::NPTi::saveEta(NPTi *this)

{
  Mat3x3d etaMat;
  RectMatrix<double,_3U,_3U> local_58;
  
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_58,0.0);
  local_58.data_[0][0] = this->eta;
  local_58.data_[1][1] = local_58.data_[0][0];
  local_58.data_[2][2] = local_58.data_[0][0];
  Snapshot::setBarostat
            ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
             (Mat3x3d *)&local_58);
  return;
}

Assistant:

void NPTi::saveEta() {
    Mat3x3d etaMat(0.0);
    etaMat(0, 0) = eta;
    etaMat(1, 1) = eta;
    etaMat(2, 2) = eta;
    snap->setBarostat(etaMat);
  }